

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<float>::VariableStatement
          (VariableStatement<float> *this,VariableP<float> *variable,ExprP<float> *value,
          bool isDeclaration)

{
  bool isDeclaration_local;
  ExprP<float> *value_local;
  VariableP<float> *variable_local;
  VariableStatement<float> *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_032d1a90;
  VariableP<float>::VariableP(&this->m_variable,variable);
  ExprP<float>::ExprP(&this->m_value,value);
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}